

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgGetDeviceID(uchar *ss,uint idLen,uint *aReadLen)

{
  uint uVar1;
  bool bVar2;
  byte local_36;
  byte local_35;
  uint local_34;
  uchar countLSB;
  uint uStack_30;
  uchar countMSB;
  uint readLen;
  uint count;
  uint err;
  uint *aReadLen_local;
  uchar *puStack_18;
  uint idLen_local;
  uchar *ss_local;
  
  local_36 = 0;
  _count = aReadLen;
  aReadLen_local._4_4_ = idLen;
  puStack_18 = ss;
  if ((ZvgIO.ecpFlags & 1) != 0) {
    terminate_1284();
  }
  if (aReadLen_local._4_4_ < 2) {
    ss_local._4_4_ = 0x13;
  }
  else {
    if ((ZvgIO.ecpFlags & 2) == 0) {
      uVar1 = negotiate_1284('\x04');
      if (uVar1 != 0) {
        return uVar1;
      }
      readLen = 0;
    }
    ZvgIO.ecpFlags = ZvgIO.ecpFlags | 2;
    readLen = getByteNb(&local_35);
    if (readLen == 0) {
      readLen = getByteNb(&local_36);
    }
    if (readLen == 0) {
      uStack_30 = (uint)local_35 * 0x100 + (uint)local_36;
      if (uStack_30 < 3) {
        terminate_1284();
        *puStack_18 = '\0';
        *_count = 0;
        ss_local._4_4_ = 0x13;
      }
      else {
        uStack_30 = uStack_30 - 2;
        if (aReadLen_local._4_4_ - 1 < uStack_30) {
          uStack_30 = aReadLen_local._4_4_ - 1;
        }
        local_34 = 0;
        while( true ) {
          bVar2 = false;
          if (local_34 < uStack_30) {
            uVar1 = isDataAvail();
            bVar2 = uVar1 != 0;
          }
          if ((!bVar2) || (readLen = getByteNb(puStack_18), readLen != 0)) break;
          puStack_18 = puStack_18 + 1;
          local_34 = local_34 + 1;
        }
        *puStack_18 = '\0';
        *_count = local_34;
        zvgSetSppMode();
        ss_local._4_4_ = readLen;
      }
    }
    else {
      ss_local._4_4_ = readLen;
    }
  }
  return ss_local._4_4_;
}

Assistant:

uint zvgGetDeviceID( uchar *ss, uint idLen, uint *aReadLen)
{
	uint	err, count, readLen;
	uchar	countMSB, countLSB=0;

	// if in ECP mode, terminate first

	if (ZvgIO.ecpFlags & ECPF_ECP)
		terminate_1284();

	if (idLen < 2)
		return (errEcpNoData);				// no room in buffer

	// do a REQ for ID using NIBBLE mode

	if (!(ZvgIO.ecpFlags & ECPF_NIBBLE))
		if ((err = (negotiate_1284( EMODE_REQID_NIBBLE))) != errOk)
			return (err);

	// up to us to set the flag

	ZvgIO.ecpFlags |= ECPF_NIBBLE;		// indicate nibble mode

	// get count word

	err = getByteNb( &countMSB);			// get a byte using nibble mode

	if (!err)
		err = getByteNb( &countLSB);

	// check for error reading first two bytes

	if (err)
		return (err);

	count = (countMSB << 8) + countLSB;

	if (count <= 2)
	{	terminate_1284();
		*ss = '\0';
		*aReadLen = 0;
		return (errEcpNoData);				// no proper ID is given
	}

	count -= 2;									// get number of bytes to read

	// check if it will fit in buffer, leave room for trailing '\0'

	if (count > idLen - 1)
		count = idLen - 1;

	readLen = 0;

	// read string of length 'count' from peripheral using the NIBBLE mode

	while (readLen < count && isDataAvail())
	{
		err = getByteNb( ss);

		if (err)
			break;

		ss++;
		readLen++;
	}
	*ss = '\0';
	*aReadLen = readLen;

	// switch to SPP mode (if not already there because of error)

	zvgSetSppMode();
	return (err);
}